

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdinput.c
# Opt level: O0

int consume_markers(j_decompress_ptr cinfo)

{
  jpeg_input_controller *pjVar1;
  int iVar2;
  int val;
  my_inputctl_ptr inputctl;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->inputctl;
  if (pjVar1->eoi_reached == 0) {
    do {
      while( true ) {
        iVar2 = (*cinfo->marker->read_markers)(cinfo);
        if (iVar2 == 0) {
          return 0;
        }
        if (iVar2 != 1) {
          if (iVar2 != 2) {
            return iVar2;
          }
          pjVar1->eoi_reached = 1;
          if (*(int *)&pjVar1[1].consume_input != 0) {
            if (cinfo->marker->saw_SOF == 0) {
              return 2;
            }
            cinfo->err->msg_code = 0x3d;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            return 2;
          }
          if (cinfo->output_scan_number <= cinfo->input_scan_number) {
            return 2;
          }
          cinfo->output_scan_number = cinfo->input_scan_number;
          return 2;
        }
        if (*(int *)&pjVar1[1].consume_input == 0) break;
        if (*(int *)&pjVar1[1].consume_input == 1) {
          initial_setup(cinfo);
        }
        if (cinfo->comps_in_scan != 0) {
          *(undefined4 *)&pjVar1[1].consume_input = 0;
          return 1;
        }
        *(undefined4 *)&pjVar1[1].consume_input = 2;
      }
      if (pjVar1->has_multiple_scans == 0) {
        cinfo->err->msg_code = 0x24;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
    } while (cinfo->comps_in_scan == 0);
    start_input_pass(cinfo);
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 2;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(int)
consume_markers (j_decompress_ptr cinfo)
{
  my_inputctl_ptr inputctl = (my_inputctl_ptr) cinfo->inputctl;
  int val;

  if (inputctl->pub.eoi_reached) /* After hitting EOI, read no further */
    return JPEG_REACHED_EOI;

  for (;;) {			/* Loop to pass pseudo SOS marker */
    val = (*cinfo->marker->read_markers) (cinfo);

    switch (val) {
    case JPEG_REACHED_SOS:	/* Found SOS */
      if (inputctl->inheaders) { /* 1st SOS */
	if (inputctl->inheaders == 1)
	  initial_setup(cinfo);
	if (cinfo->comps_in_scan == 0) { /* pseudo SOS marker */
	  inputctl->inheaders = 2;
	  break;
	}
	inputctl->inheaders = 0;
	/* Note: start_input_pass must be called by jdmaster.c
	 * before any more input can be consumed.  jdapimin.c is
	 * responsible for enforcing this sequencing.
	 */
      } else {			/* 2nd or later SOS marker */
	if (! inputctl->pub.has_multiple_scans)
	  ERREXIT(cinfo, JERR_EOI_EXPECTED); /* Oops, I wasn't expecting this! */
	if (cinfo->comps_in_scan == 0) /* unexpected pseudo SOS marker */
	  break;
	start_input_pass(cinfo);
      }
      return val;
    case JPEG_REACHED_EOI:	/* Found EOI */
      inputctl->pub.eoi_reached = TRUE;
      if (inputctl->inheaders) { /* Tables-only datastream, apparently */
	if (cinfo->marker->saw_SOF)
	  ERREXIT(cinfo, JERR_SOF_NO_SOS);
      } else {
	/* Prevent infinite loop in coef ctlr's decompress_data routine
	 * if user set output_scan_number larger than number of scans.
	 */
	if (cinfo->output_scan_number > cinfo->input_scan_number)
	  cinfo->output_scan_number = cinfo->input_scan_number;
      }
      return val;
    case JPEG_SUSPENDED:
      return val;
    default:
      return val;
    }
  }
}